

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_str_constraint.h
# Opt level: O0

void handle_error(char *orig_dest,rsize_t orig_dmax,char *err_msg,errno_t err_code)

{
  undefined4 in_ECX;
  undefined1 *in_RDI;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  *in_RDI = 0;
  invoke_safe_str_constraint_handler
            ((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,0);
  return;
}

Assistant:

static inline void handle_error(char *orig_dest, rsize_t orig_dmax,
                                char *err_msg, errno_t err_code)
{
#ifdef SAFECLIB_STR_NULL_SLACK
    /* null string to eliminate partial copy */
    while (orig_dmax) { *orig_dest = '\0'; orig_dmax--; orig_dest++; }
#else
    *orig_dest = '\0';
#endif

    invoke_safe_str_constraint_handler(err_msg, NULL, err_code);
    return;
}